

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

int luaL_loadfilex(lua_State *L,char *filename,char *mode)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  int c;
  LoadF lf;
  int local_2044;
  LoadF local_2040;
  
  iVar1 = lua_gettop(L);
  iVar1 = iVar1 + 1;
  if (filename == (char *)0x0) {
    lua_pushstring(L,"=stdin");
    local_2040.f = (FILE *)_stdin;
  }
  else {
    lua_pushfstring(L,"@%s",filename);
    local_2040.f = (FILE *)fopen64(filename,"r");
    if ((FILE *)local_2040.f == (FILE *)0x0) {
      pcVar5 = "open";
      goto LAB_0010dae7;
    }
  }
  iVar2 = skipcomment(&local_2040,&local_2044);
  if (iVar2 != 0) {
    lVar4 = (long)local_2040.n;
    local_2040.n = local_2040.n + 1;
    local_2040.buff[lVar4] = '\n';
  }
  if (filename != (char *)0x0 && local_2044 == 0x1b) {
    local_2040.f = (FILE *)freopen64(filename,"rb",(FILE *)local_2040.f);
    if ((FILE *)local_2040.f == (FILE *)0x0) {
      pcVar5 = "reopen";
      goto LAB_0010dae7;
    }
    skipcomment(&local_2040,&local_2044);
  }
  if (local_2044 != -1) {
    lVar4 = (long)local_2040.n;
    local_2040.n = local_2040.n + 1;
    local_2040.buff[lVar4] = (char)local_2044;
  }
  pcVar5 = lua_tolstring(L,-1,(size_t *)0x0);
  iVar2 = lua_load(L,getF,&local_2040,pcVar5,mode);
  __stream = local_2040.f;
  iVar3 = ferror((FILE *)local_2040.f);
  if (filename != (char *)0x0) {
    fclose((FILE *)__stream);
  }
  if (iVar3 == 0) {
    lua_rotate(L,iVar1,-1);
    lua_settop(L,-2);
    return iVar2;
  }
  lua_settop(L,iVar1);
  pcVar5 = "read";
LAB_0010dae7:
  errfile(L,pcVar5,iVar1);
  return 7;
}

Assistant:

LUALIB_API int luaL_loadfilex (lua_State *L, const char *filename,
                                             const char *mode) {
  LoadF lf;
  int status, readstatus;
  int c;
  int fnameindex = lua_gettop(L) + 1;  /* index of filename on the stack */
  if (filename == NULL) {
    lua_pushliteral(L, "=stdin");
    lf.f = stdin;
  }
  else {
    lua_pushfstring(L, "@%s", filename);
    lf.f = fopen(filename, "r");
    if (lf.f == NULL) return errfile(L, "open", fnameindex);
  }
  if (skipcomment(&lf, &c))  /* read initial portion */
    lf.buff[lf.n++] = '\n';  /* add line to correct line numbers */
  if (c == LUA_SIGNATURE[0] && filename) {  /* binary file? */
    lf.f = freopen(filename, "rb", lf.f);  /* reopen in binary mode */
    if (lf.f == NULL) return errfile(L, "reopen", fnameindex);
    skipcomment(&lf, &c);  /* re-read initial portion */
  }
  if (c != EOF)
    lf.buff[lf.n++] = c;  /* 'c' is the first character of the stream */
  status = lua_load(L, getF, &lf, lua_tostring(L, -1), mode);
  readstatus = ferror(lf.f);
  if (filename) fclose(lf.f);  /* close file (even in case of errors) */
  if (readstatus) {
    lua_settop(L, fnameindex);  /* ignore results from 'lua_load' */
    return errfile(L, "read", fnameindex);
  }
  lua_remove(L, fnameindex);
  return status;
}